

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_StopNetworkSyntaxSuccess_Test::TestBody
          (InterpreterTestSuite_PC_StopNetworkSyntaxSuccess_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  undefined8 this_01;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  CommissionerAppMock *pCVar5;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_02;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar6;
  ReturnAction<ot::commissioner::Error> *action_1;
  element_type *peVar7;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pMVar8;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar9;
  MockSpec<bool_()> *pMVar10;
  TypedExpectation<bool_()> *pTVar11;
  element_type *this_03;
  WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:1092:30),_0UL>
  WVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_1018;
  string local_de8;
  AssertHelper local_dc8;
  Message local_dc0;
  bool local_db1;
  undefined1 local_db0 [8];
  AssertionResult gtest_ar__1;
  allocator local_d51;
  string local_d50;
  Expression local_d30;
  string local_d18;
  AssertHelper local_cf8;
  Message local_cf0;
  bool local_ce1;
  undefined1 local_ce0 [8];
  AssertionResult gtest_ar_;
  allocator local_c81;
  string local_c80;
  Expression local_c60;
  undefined1 local_c48 [8];
  Value value;
  Expression expr;
  Action<bool_()> local_bd8;
  ReturnAction<bool> local_bb8;
  Action<bool_()> local_ba8;
  WithoutMatchers local_b81;
  MockSpec<bool_()> local_b80;
  ReturnAction<bool> local_b70;
  undefined1 local_b60 [32];
  ReturnAction<bool> local_b40;
  Action<bool_()> local_b30;
  WithoutMatchers local_b09;
  MockSpec<bool_()> local_b08;
  Error local_af8;
  ReturnAction<ot::commissioner::Error> local_ad0;
  undefined1 local_ac0 [40];
  Matcher<unsigned_short> local_a98;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a80;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a68;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_a50;
  Error local_a00;
  ReturnAction<ot::commissioner::Error> local_9d8;
  Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_9c8;
  WithoutMatchers local_9a1;
  Matcher<unsigned_short> local_9a0;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_988;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_970;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_958;
  Error local_908;
  WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:1092:30),_0UL>
  local_8e0;
  anon_class_16_2_c9c4efc7_for_action local_8d0;
  ReturnAction<ot::commissioner::Error> *local_8c0;
  uint8_t *local_8b8;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:1092:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_8b0;
  Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_890;
  WithoutMatchers local_869;
  Matcher<const_ot::commissioner::Config_&> local_868;
  Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_850;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_838;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_800;
  undefined1 local_7f8 [8];
  CommissionerAppMockPtr commissionerAppMocks [2];
  undefined1 local_7c9 [8];
  uint8_t camIdx;
  Message local_7c0;
  Status local_7b1;
  UnixTime local_7b0;
  allocator local_7a1;
  string local_7a0;
  allocator local_779;
  string local_778;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_758;
  allocator local_731;
  string local_730;
  Timestamp local_710;
  allocator local_701;
  string local_700;
  allocator local_6d9;
  string local_6d8;
  allocator local_6b1;
  string local_6b0;
  State local_690;
  allocator local_689;
  string local_688;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_668;
  allocator local_641;
  string local_640;
  BorderAgent local_620;
  Status local_4a1;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_488;
  Message local_480;
  Status local_471;
  UnixTime local_470;
  allocator local_461;
  string local_460;
  allocator local_439;
  string local_438;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_418;
  allocator local_3f1;
  string local_3f0;
  Timestamp local_3d0;
  allocator local_3c1;
  string local_3c0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  State local_350;
  allocator local_349;
  string local_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  allocator local_301;
  string local_300;
  BorderAgent local_2e0;
  Status local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_StopNetworkSyntaxSuccess_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  this_01 = ctx.mInterpreter._192_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"127.0.0.1",&local_301);
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"1.1",&local_349);
  ot::commissioner::BorderAgent::State::State(&local_350,0,0,0,0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"net1",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"",&local_3c1);
  local_3d0 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"",&local_3f1);
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"domain1",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"",&local_461);
  ot::commissioner::UnixTime::UnixTime(&local_470,0);
  ot::commissioner::BorderAgent::BorderAgent
            (&local_2e0,&local_300,0x4e21,&local_328,&local_348,local_350,&local_370,1,&local_398,
             &local_3c0,local_3d0,0,&local_3f0,&local_418,&local_438,'\0',0,&local_460,local_470,
             0x103f);
  local_161 = ot::commissioner::persistent_storage::Registry::Add((Registry *)this_01,&local_2e0);
  local_471 = kSuccess;
  testing::internal::EqHelper::
  Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
            ((EqHelper *)local_160,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_161,&local_471);
  ot::commissioner::BorderAgent::~BorderAgent(&local_2e0);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_418);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_328);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar2) {
    testing::Message::Message(&local_480);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x437,pcVar3);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    testing::Message::~Message(&local_480);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_640,"127.0.0.2",&local_641);
    local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_668);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_688,"1.1",&local_689);
    ot::commissioner::BorderAgent::State::State(&local_690,0,0,0,0,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6b0,"net2",&local_6b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6d8,"",&local_6d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_700,"",&local_701);
    local_710 = (Timestamp)0x0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_730,"",&local_731);
    local_758.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_758.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_758.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_778,"domain2",&local_779);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7a0,"",&local_7a1);
    ot::commissioner::UnixTime::UnixTime(&local_7b0,0);
    pcVar3 = (char *)(ulong)(uint)local_690;
    ot::commissioner::BorderAgent::BorderAgent
              (&local_620,&local_640,0x4e21,&local_668,&local_688,local_690,&local_6b0,2,&local_6d8,
               &local_700,local_710,0,&local_730,&local_758,&local_778,'\0',0,&local_7a0,local_7b0,
               0x103f);
    local_4a1 = ot::commissioner::persistent_storage::Registry::Add
                          ((Registry *)ctx.mInterpreter._192_8_,&local_620);
    local_7b1 = kSuccess;
    testing::internal::EqHelper::
    Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
              ((EqHelper *)local_4a0,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_4a1,&local_7b1);
    ot::commissioner::BorderAgent::~BorderAgent(&local_620);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_758);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator((allocator<char> *)&local_701);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator((allocator<char> *)&local_689);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_668);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator((allocator<char> *)&local_641);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
    if (!bVar2) {
      testing::Message::Message(&local_7c0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_7c9 + 1),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x43c,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)(local_7c9 + 1),&local_7c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_7c9 + 1));
      testing::Message::~Message(&local_7c0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_7c9[0] = 0;
      local_800 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_7f8;
      pCVar5 = (CommissionerAppMock *)operator_new(0x1838);
      memset(pCVar5,0,0x1838);
      CommissionerAppMock::CommissionerAppMock(pCVar5);
      std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
                ((shared_ptr<CommissionerAppMock> *)local_7f8,pCVar5);
      this_00 = &commissionerAppMocks[0].
                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_800 = this_00;
      pCVar5 = (CommissionerAppMock *)operator_new(0x1838);
      memset(pCVar5,0,0x1838);
      CommissionerAppMock::CommissionerAppMock(pCVar5);
      std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
                ((shared_ptr<CommissionerAppMock> *)this_00,pCVar5);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_850,(AnythingMatcher *)&testing::_);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_868,(AnythingMatcher *)&testing::_);
      CommissionerAppStaticExpecter::gmock_Create
                (&local_838,
                 (CommissionerAppStaticExpecter *)
                 &ctx.mDefaultCommissionerObject.
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_850,&local_868);
      testing::internal::GetWithoutMatchers();
      this_02 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                ::operator()(&local_838,&local_869,(void *)0x0);
      pTVar6 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
               ::InternalExpectedAt
                         (this_02,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x441,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
      pTVar6 = testing::internal::
               TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
               ::Times(pTVar6,2);
      local_8d0.commissionerAppMocks = (CommissionerAppMockPtr (*) [2])local_7f8;
      local_8d0.camIdx = local_7c9;
      WVar12 = testing::
               WithArg<0ul,InterpreterTestSuite_PC_StopNetworkSyntaxSuccess_Test::TestBody()::__0>
                         (&local_8d0);
      local_8b8 = WVar12.action.camIdx;
      action_1 = (ReturnAction<ot::commissioner::Error> *)WVar12.action.commissionerAppMocks;
      local_8c0 = action_1;
      ot::commissioner::Error::Error(&local_908);
      testing::Return<ot::commissioner::Error>((testing *)&local_8e0,&local_908);
      testing::
      DoAll<testing::internal::WithArgsAction<InterpreterTestSuite_PC_StopNetworkSyntaxSuccess_Test::TestBody()::__0,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                (&local_8b0,(testing *)&local_8c0,&local_8e0,action_1);
      testing::internal::DoAllAction::operator_cast_to_Action(&local_890,(DoAllAction *)&local_8b0);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::WillRepeatedly(pTVar6,&local_890);
      testing::
      Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::~Action(&local_890);
      testing::internal::
      DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1092:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
      ::~DoAllAction(&local_8b0);
      testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction
                ((ReturnAction<ot::commissioner::Error> *)&local_8e0);
      ot::commissioner::Error::~Error(&local_908);
      testing::internal::
      MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::~MockSpec(&local_838);
      testing::Matcher<const_ot::commissioner::Config_&>::~Matcher(&local_868);
      testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::~Matcher(&local_850);
      peVar7 = std::
               __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_7f8);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_970,(AnythingMatcher *)&testing::_);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_988,(AnythingMatcher *)&testing::_);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_9a0,(AnythingMatcher *)&testing::_);
      CommissionerAppMock::gmock_Start(&local_958,peVar7,&local_970,&local_988,&local_9a0);
      testing::internal::GetWithoutMatchers();
      pMVar8 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::operator()(&local_958,&local_9a1,(void *)0x0);
      pTVar9 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::InternalExpectedAt
                         (pMVar8,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x446,"*commissionerAppMocks[0]","Start(_, _, _)");
      pTVar9 = testing::internal::
               TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::Times(pTVar9,1);
      ot::commissioner::Error::Error(&local_a00);
      testing::Return<ot::commissioner::Error>((testing *)&local_9d8,&local_a00);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_9c8,(ReturnAction *)&local_9d8);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::WillRepeatedly(pTVar9,&local_9c8);
      testing::
      Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::~Action(&local_9c8);
      testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_9d8);
      ot::commissioner::Error::~Error(&local_a00);
      testing::internal::
      MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::~MockSpec(&local_958);
      testing::Matcher<unsigned_short>::~Matcher(&local_9a0);
      testing::
      Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~Matcher(&local_988);
      testing::
      Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
      ~Matcher(&local_970);
      peVar7 = std::
               __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&commissionerAppMocks[0].
                             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_a68,(AnythingMatcher *)&testing::_);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_a80,(AnythingMatcher *)&testing::_);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_a98,(AnythingMatcher *)&testing::_);
      CommissionerAppMock::gmock_Start(&local_a50,peVar7,&local_a68,&local_a80,&local_a98);
      testing::internal::GetWithoutMatchers();
      pMVar8 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::operator()(&local_a50,(WithoutMatchers *)(local_ac0 + 0x27),(void *)0x0);
      pTVar9 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::InternalExpectedAt
                         (pMVar8,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x447,"*commissionerAppMocks[1]","Start(_, _, _)");
      pTVar9 = testing::internal::
               TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::Times(pTVar9,1);
      ot::commissioner::Error::Error(&local_af8);
      testing::Return<ot::commissioner::Error>((testing *)&local_ad0,&local_af8);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)local_ac0,(ReturnAction *)&local_ad0);
      pCVar5 = (CommissionerAppMock *)local_ac0;
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::WillRepeatedly(pTVar9,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                               *)pCVar5);
      testing::
      Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::~Action((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                 *)local_ac0);
      testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_ad0);
      ot::commissioner::Error::~Error(&local_af8);
      testing::internal::
      MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::~MockSpec(&local_a50);
      testing::Matcher<unsigned_short>::~Matcher(&local_a98);
      testing::
      Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~Matcher(&local_a80);
      testing::
      Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
      ~Matcher(&local_a68);
      peVar7 = std::
               __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_7f8);
      local_b08.function_mocker_ =
           (FunctionMocker<bool_()> *)
           CommissionerAppMock::gmock_IsActive((MockSpec<bool_()> *)peVar7,pCVar5);
      testing::internal::GetWithoutMatchers();
      pMVar10 = testing::internal::MockSpec<bool_()>::operator()(&local_b08,&local_b09,(void *)0x0);
      pTVar11 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                          (pMVar10,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                           ,0x448,"*commissionerAppMocks[0]","IsActive()");
      testing::Return<bool>((testing *)&local_b40,false);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_b30,(ReturnAction *)&local_b40);
      pTVar11 = testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar11,&local_b30);
      testing::Return<bool>((testing *)&local_b70,true);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<bool_()> *)local_b60,(ReturnAction *)&local_b70);
      pCVar5 = (CommissionerAppMock *)local_b60;
      testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar11,(Action<bool_()> *)pCVar5);
      testing::Action<bool_()>::~Action((Action<bool_()> *)local_b60);
      testing::internal::ReturnAction<bool>::~ReturnAction(&local_b70);
      testing::Action<bool_()>::~Action(&local_b30);
      testing::internal::ReturnAction<bool>::~ReturnAction(&local_b40);
      peVar7 = std::
               __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&commissionerAppMocks[0].
                             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      local_b80.function_mocker_ =
           (FunctionMocker<bool_()> *)
           CommissionerAppMock::gmock_IsActive((MockSpec<bool_()> *)peVar7,pCVar5);
      testing::internal::GetWithoutMatchers();
      pMVar10 = testing::internal::MockSpec<bool_()>::operator()(&local_b80,&local_b81,(void *)0x0);
      pTVar11 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                          (pMVar10,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                           ,0x449,"*commissionerAppMocks[1]","IsActive()");
      testing::Return<bool>((testing *)&local_bb8,false);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_ba8,(ReturnAction *)&local_bb8);
      pTVar11 = testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar11,&local_ba8);
      testing::Return<bool>
                ((testing *)
                 &expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_bd8,
                 (ReturnAction *)
                 &expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar11,&local_bd8);
      testing::Action<bool_()>::~Action(&local_bd8);
      testing::internal::ReturnAction<bool>::~ReturnAction
                ((ReturnAction<bool> *)
                 &expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Action<bool_()>::~Action(&local_ba8);
      testing::internal::ReturnAction<bool>::~ReturnAction(&local_bb8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&value.mData.field_2 + 8));
      ot::commissioner::Interpreter::Value::Value((Value *)local_c48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c80,"start --nwk net1 net2",&local_c81);
      ot::commissioner::Interpreter::ParseExpression(&local_c60,(Interpreter *)local_140,&local_c80)
      ;
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&value.mData.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(pvVar1,&local_c60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c60);
      std::__cxx11::string::~string((string *)&local_c80);
      std::allocator<char>::~allocator((allocator<char> *)&local_c81);
      ot::commissioner::Interpreter::Eval
                ((Value *)&gtest_ar_.message_,(Interpreter *)local_140,pvVar1);
      ot::commissioner::Interpreter::Value::operator=
                ((Value *)local_c48,(Value *)&gtest_ar_.message_);
      ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
      local_ce1 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_c48);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_ce0,&local_ce1,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce0);
      if (!bVar2) {
        testing::Message::Message(&local_cf0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_d18,(internal *)local_ce0,(AssertionResult *)0x46a487,"false","true",
                   pcVar3);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_cf8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x44f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_cf8,&local_cf0);
        testing::internal::AssertHelper::~AssertHelper(&local_cf8);
        std::__cxx11::string::~string((string *)&local_d18);
        testing::Message::~Message(&local_cf0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce0);
      ot::commissioner::Interpreter::MultiNetCommandContext::Cleanup
                ((MultiNetCommandContext *)local_140);
      this_03 = std::
                __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)((long)&ctx.mInterpreter.mContext.mCommandKeys.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 0x10));
      ot::commissioner::JobManager::CleanupJobs(this_03);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d50,"stop --nwk net1 net2",&local_d51);
      ot::commissioner::Interpreter::ParseExpression(&local_d30,(Interpreter *)local_140,&local_d50)
      ;
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&value.mData.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(pvVar1,&local_d30);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d30);
      std::__cxx11::string::~string((string *)&local_d50);
      std::allocator<char>::~allocator((allocator<char> *)&local_d51);
      ot::commissioner::Interpreter::Eval
                ((Value *)&gtest_ar__1.message_,(Interpreter *)local_140,pvVar1);
      ot::commissioner::Interpreter::Value::operator=
                ((Value *)local_c48,(Value *)&gtest_ar__1.message_);
      ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__1.message_);
      local_db1 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_c48);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_db0,&local_db1,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db0);
      if (!bVar2) {
        testing::Message::Message(&local_dc0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_de8,(internal *)local_db0,(AssertionResult *)0x46a487,"false","true",
                   pcVar3);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_dc8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x455,pcVar3);
        testing::internal::AssertHelper::operator=(&local_dc8,&local_dc0);
        testing::internal::AssertHelper::~AssertHelper(&local_dc8);
        std::__cxx11::string::~string((string *)&local_de8);
        testing::Message::~Message(&local_dc0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_db0);
      ot::commissioner::Interpreter::Value::~Value((Value *)local_c48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&value.mData.field_2 + 8));
      local_1018 = &commissionerAppMocks[1].
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      do {
        local_1018 = local_1018 + -2;
        std::shared_ptr<CommissionerAppMock>::~shared_ptr
                  ((shared_ptr<CommissionerAppMock> *)local_1018);
      } while (local_1018 != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_7f8);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_StopNetworkSyntaxSuccess)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[2] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(2)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[0], Start(_, _, _)).Times(1).WillRepeatedly(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[1], Start(_, _, _)).Times(1).WillRepeatedly(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[0], IsActive()).WillOnce(Return(false)).WillOnce(Return(true));
    EXPECT_CALL(*commissionerAppMocks[1], IsActive()).WillOnce(Return(false)).WillOnce(Return(true));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("start --nwk net1 net2");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    expr  = ctx.mInterpreter.ParseExpression("stop --nwk net1 net2");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}